

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O1

void __thiscall
cli::Parser::set_callback<bool>
          (Parser *this,string *name,string *alternative,
          function<bool_(cli::CallbackArgs_&)> *callback,string *description)

{
  pointer *pppCVar1;
  iterator __position;
  CmdBase *this_00;
  CmdBase *local_38;
  
  this_00 = (CmdBase *)operator_new(0xd0);
  CmdBase::CmdBase(this_00,name,alternative,description,false);
  this_00->_vptr_CmdBase = (_func_int **)&PTR__CmdFunction_001257c8;
  this_00[1]._vptr_CmdBase = (_func_int **)0x0;
  this_00[1].name._M_dataplus._M_p = (pointer)0x0;
  this_00[1].name._M_string_length = 0;
  this_00[1].name.field_2._M_allocated_capacity = 0;
  std::function<bool_(cli::CallbackArgs_&)>::operator=
            ((function<bool_(cli::CallbackArgs_&)> *)(this_00 + 1),callback);
  __position._M_current =
       (this->_commands).
       super__Vector_base<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->_commands).
      super__Vector_base<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_38 = this_00;
    std::vector<cli::Parser::CmdBase*,std::allocator<cli::Parser::CmdBase*>>::
    _M_realloc_insert<cli::Parser::CmdBase*>
              ((vector<cli::Parser::CmdBase*,std::allocator<cli::Parser::CmdBase*>> *)
               &this->_commands,__position,&local_38);
  }
  else {
    *__position._M_current = this_00;
    pppCVar1 = &(this->_commands).
                super__Vector_base<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppCVar1 = *pppCVar1 + 1;
  }
  return;
}

Assistant:

void set_callback(const std::string& name, const std::string& alternative, std::function<T(CallbackArgs&)> callback, const std::string& description = "") {
			auto command = new CmdFunction<T> { name, alternative, description, false };
			command->callback = callback;
			_commands.push_back(command);
		}